

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_lazy_or_inplace
               (roaring_bitmap_t *x1,roaring_bitmap_t *x2,_Bool bitsetconversion)

{
  uint8_t type;
  int32_t start_index;
  int end_index;
  roaring_array_t *sa;
  roaring_bitmap_t *ra;
  _Bool _Var1;
  uint8_t uVar2;
  container_t *pcVar3;
  container_t *c_00;
  container_t *c2_1;
  container_t *c;
  container_t *c2;
  uint8_t old_type1;
  container_t *old_c1;
  container_t *c1;
  ushort local_30;
  uint8_t local_2e;
  uint8_t local_2d;
  int iStack_2c;
  uint16_t s2;
  uint16_t s1;
  uint8_t type2;
  uint8_t type1;
  int pos2;
  int pos1;
  int length2;
  int length1;
  uint8_t result_type;
  _Bool bitsetconversion_local;
  roaring_bitmap_t *x2_local;
  roaring_bitmap_t *x1_local;
  
  length2._2_1_ = '\0';
  pos1 = (x1->high_low_container).size;
  pos2 = (x2->high_low_container).size;
  if (pos2 != 0) {
    length2._3_1_ = bitsetconversion;
    _length1 = &x2->high_low_container;
    x2_local = x1;
    if (pos1 == 0) {
      roaring_bitmap_overwrite(x1,x2);
    }
    else {
      _s1 = 0;
      iStack_2c = 0;
      local_30 = ra_get_key_at_index(&x1->high_low_container,0);
      c1._6_2_ = ra_get_key_at_index(_length1,(uint16_t)iStack_2c);
      while( true ) {
        while (local_30 != c1._6_2_) {
          if (local_30 < c1._6_2_) {
            _s1 = _s1 + 1;
            if (_s1 == pos1) goto LAB_0014342a;
            local_30 = ra_get_key_at_index(&x2_local->high_low_container,(uint16_t)_s1);
          }
          else {
            pcVar3 = ra_get_container_at_index(_length1,(uint16_t)iStack_2c,&local_2e);
            _Var1 = is_cow((roaring_bitmap_t *)_length1);
            pcVar3 = get_copy_of_container(pcVar3,&local_2e,_Var1);
            _Var1 = is_cow((roaring_bitmap_t *)_length1);
            if (_Var1) {
              ra_set_container_at_index(_length1,iStack_2c,pcVar3,local_2e);
            }
            ra_insert_new_key_value_at(&x2_local->high_low_container,_s1,c1._6_2_,pcVar3,local_2e);
            _s1 = _s1 + 1;
            pos1 = pos1 + 1;
            iStack_2c = iStack_2c + 1;
            if (iStack_2c == pos2) goto LAB_0014342a;
            c1._6_2_ = ra_get_key_at_index(_length1,(uint16_t)iStack_2c);
          }
        }
        pcVar3 = ra_get_container_at_index(&x2_local->high_low_container,(uint16_t)_s1,&local_2d);
        _Var1 = container_is_full(pcVar3,local_2d);
        if (!_Var1) {
          if (((length2._3_1_ & 1) == 0) ||
             (uVar2 = get_container_type(pcVar3,local_2d), type = local_2d, uVar2 == '\x01')) {
            old_c1 = get_writable_copy_if_shared(pcVar3,&local_2d);
          }
          else {
            c_00 = container_mutable_unwrap_shared(pcVar3,&local_2d);
            old_c1 = container_to_bitset(c_00,local_2d);
            container_free(pcVar3,type);
            local_2d = '\x01';
          }
          pcVar3 = ra_get_container_at_index(_length1,(uint16_t)iStack_2c,&local_2e);
          pcVar3 = container_lazy_ior(old_c1,local_2d,pcVar3,local_2e,
                                      (uint8_t *)((long)&length2 + 2));
          if (pcVar3 != old_c1) {
            container_free(old_c1,local_2d);
          }
          ra_set_container_at_index(&x2_local->high_low_container,_s1,pcVar3,length2._2_1_);
        }
        _s1 = _s1 + 1;
        iStack_2c = iStack_2c + 1;
        if ((_s1 == pos1) || (iStack_2c == pos2)) break;
        local_30 = ra_get_key_at_index(&x2_local->high_low_container,(uint16_t)_s1);
        c1._6_2_ = ra_get_key_at_index(_length1,(uint16_t)iStack_2c);
      }
LAB_0014342a:
      ra = x2_local;
      sa = _length1;
      end_index = pos2;
      start_index = iStack_2c;
      if (_s1 == pos1) {
        _Var1 = is_cow((roaring_bitmap_t *)_length1);
        ra_append_copy_range(&ra->high_low_container,sa,start_index,end_index,_Var1);
      }
    }
  }
  return;
}

Assistant:

void roaring_bitmap_lazy_or_inplace(roaring_bitmap_t *x1,
                                    const roaring_bitmap_t *x2,
                                    const bool bitsetconversion) {
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            if (!container_is_full(c1, type1)) {
                if ((bitsetconversion == false) ||
                    (get_container_type(c1, type1) == BITSET_CONTAINER_TYPE)
                ){
                    c1 = get_writable_copy_if_shared(c1, &type1);
                } else {
                    // convert to bitset
                    container_t *old_c1 = c1;
                    uint8_t old_type1 = type1;
                    c1 = container_mutable_unwrap_shared(c1, &type1);
                    c1 = container_to_bitset(c1, type1);
                    container_free(old_c1, old_type1);
                    type1 = BITSET_CONTAINER_TYPE;
                }

                container_t *c2 = ra_get_container_at_index(
                                        &x2->high_low_container, pos2, &type2);
                container_t *c = container_lazy_ior(c1, type1, c2, type2,
                                                    &result_type);

                if (c != c1) {  // in this instance a new container was created,
                                // and we need to free the old one
                    container_free(c1, type1);
                }

                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            // container_t *c2_clone = container_clone(c2, type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}